

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

void Acb_ObjPatchFanin(Acb_Ntk_t *p,int iObj,int iFanin,int iFaninNew)

{
  uint uVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = (p->vObjFans).pArray[(uint)iObj];
  if (((int)uVar1 < 0) || ((p->vFanSto).nSize <= (int)uVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  if (iFanin == iFaninNew) {
    __assert_fail("iFanin != iFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x229,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
  piVar2 = (p->vFanSto).pArray;
  iVar4 = piVar2[uVar1];
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      if (piVar2[(ulong)uVar1 + lVar5 + 1] == iFanin) {
        piVar2[(ulong)uVar1 + lVar5 + 1] = iFaninNew;
        iVar4 = piVar2[uVar1];
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  uVar1 = (p->vFanouts).nSize;
  if ((int)uVar1 < 1) {
    return;
  }
  if ((-1 < iFanin) && ((uint)iFanin < uVar1)) {
    pVVar3 = (p->vFanouts).pArray;
    iVar4 = pVVar3[(uint)iFanin].nSize;
    if ((long)iVar4 < 1) {
      if (iVar4 != 0) {
        __assert_fail("i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
      }
    }
    else {
      piVar2 = pVVar3[(uint)iFanin].pArray;
      lVar5 = 1;
      do {
        if (piVar2[lVar5 + -1] == iObj) {
          if ((int)lVar5 < iVar4) {
            do {
              piVar2[lVar5 + -1] = piVar2[lVar5];
              lVar5 = lVar5 + 1;
              iVar4 = pVVar3[(uint)iFanin].nSize;
            } while ((int)lVar5 < iVar4);
          }
          pVVar3[(uint)iFanin].nSize = iVar4 + -1;
          if ((-1 < iFaninNew) && (iFaninNew < (p->vFanouts).nSize)) {
            Vec_IntPush(pVVar3 + (uint)iFaninNew,iObj);
            return;
          }
          goto LAB_003a8b03;
        }
        bVar6 = lVar5 != iVar4;
        lVar5 = lVar5 + 1;
      } while (bVar6);
    }
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x230,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
LAB_003a8b03:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

static inline void Acb_ObjPatchFanin( Acb_Ntk_t * p, int iObj, int iFanin, int iFaninNew )
{
    int i, RetValue, * pFanins = Acb_ObjFanins( p, iObj );
    assert( iFanin != iFaninNew );
    for ( i = 0; i < pFanins[0]; i++ )
        if ( pFanins[ 1 + i ] == iFanin )
            pFanins[ 1 + i ] = iFaninNew;
    if ( !Acb_NtkHasObjFanout(p) )
        return;
    RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFaninNew), iObj );
}